

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Entity.cpp
# Opt level: O1

Entity * __thiscall
Entity::checkCollisions(Entity *this,list<Entity_*,_std::allocator<Entity_*>_> *e)

{
  _List_node_base *p_Var1;
  Entity *pEVar2;
  bool bVar3;
  Entity *unaff_RBX;
  
  p_Var1 = (e->super__List_base<Entity_*,_std::allocator<Entity_*>_>)._M_impl._M_node.
           super__List_node_base._M_next;
  while( true ) {
    if (p_Var1 == (_List_node_base *)e) {
      return (Entity *)0x0;
    }
    pEVar2 = (Entity *)p_Var1[1]._M_next;
    bVar3 = false;
    if (((pEVar2 != this) && (pEVar2->isDestructable == true)) &&
       (bVar3 = checkCircleCollision
                          (pEVar2->x,pEVar2->y,pEVar2->radius,this->x,this->y,this->radius), bVar3))
    {
      unaff_RBX = pEVar2;
    }
    if (bVar3 != false) break;
    p_Var1 = (((_List_base<Entity_*,_std::allocator<Entity_*>_> *)&p_Var1->_M_next)->_M_impl).
             _M_node.super__List_node_base._M_next;
  }
  return unaff_RBX;
}

Assistant:

Entity *Entity::checkCollisions(std::list<Entity *>& e)
{
   std::list<Entity *>::iterator it;

   for (it = e.begin(); it != e.end(); it++) {
      Entity *entity = *it;
      if (entity == this || !entity->getDestructable())
         continue;
      float ex = entity->getX();
      float ey = entity->getY();
      float er = entity->getRadius();
      if (checkCircleCollision(ex, ey, er, x, y, radius))
         return entity;
   }

   return 0;
}